

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O1

int zip_entry_isdir(zip_t *zip)

{
  char cVar1;
  char *__s;
  size_t sVar2;
  
  if (zip == (zip_t *)0x0) {
    return -1;
  }
  if (-1 < (zip->entry).index) {
    __s = (zip->entry).name;
    sVar2 = strlen(__s);
    cVar1 = __s[(sVar2 & 0xffff) - 1];
    return (int)(cVar1 == '\\' || cVar1 == '/');
  }
  return -10;
}

Assistant:

int zip_entry_isdir(struct zip_t *zip) {
  mz_uint16 entrylen;
  if (!zip) {
    // zip_t handler is not initialized
    return ZIP_ENOINIT;
  }

  if (zip->entry.index < (ssize_t)0) {
    // zip entry is not opened
    return ZIP_EINVIDX;
  }

  entrylen = (mz_uint16)strlen(zip->entry.name);
  return ISSLASH(zip->entry.name[entrylen - 1]);
}